

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::TokenizerTest_ParseInteger_Test::TestBody
          (TokenizerTest_ParseInteger_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Message *pMVar3;
  char *in_R9;
  AssertHelper local_fa8;
  Message local_fa0;
  undefined1 local_f98 [8];
  AssertionResult gtest_ar_13;
  AssertHelper local_f68;
  Message local_f60;
  allocator<char> local_f51;
  string local_f50;
  bool local_f29;
  undefined1 local_f28 [8];
  AssertionResult gtest_ar__23;
  uint64_t parsed_11;
  AssertHelper local_ef0;
  Message local_ee8;
  allocator<char> local_ed9;
  string local_ed8;
  bool local_eb1;
  undefined1 local_eb0 [8];
  AssertionResult gtest_ar__22;
  uint64_t parsed_10;
  char hex_1 [32];
  uint64_t ui;
  Message local_e68;
  undefined1 local_e60 [8];
  AssertionResult gtest_ar_12;
  AssertHelper local_e30;
  Message local_e28;
  allocator<char> local_e19;
  string local_e18;
  bool local_df1;
  undefined1 local_df0 [8];
  AssertionResult gtest_ar__21;
  uint64_t parsed_9;
  char octal_2 [32];
  string local_db0;
  AssertHelper local_d90;
  Message local_d88;
  allocator<char> local_d79;
  string local_d78;
  bool local_d51;
  undefined1 local_d50 [8];
  AssertionResult gtest_ar__20;
  uint64_t parsed_8;
  char octal_1 [32];
  unsigned_long local_d10;
  uint64_t i_3;
  Message local_d00;
  undefined1 local_cf8 [8];
  AssertionResult gtest_ar_11;
  AssertHelper local_cc8;
  Message local_cc0;
  allocator<char> local_cb1;
  string local_cb0;
  bool local_c89;
  undefined1 local_c88 [8];
  AssertionResult gtest_ar__19;
  uint64_t parsed_7;
  AssertHelper local_c50;
  Message local_c48;
  allocator<char> local_c39;
  string local_c38;
  bool local_c11;
  undefined1 local_c10 [8];
  AssertionResult gtest_ar__18;
  uint64_t parsed_6;
  char decimal_1 [32];
  uint64_t i_2;
  int64_t offset_1;
  Message local_bc0;
  undefined1 local_bb8 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_b88;
  Message local_b80;
  allocator<char> local_b71;
  string local_b70;
  bool local_b49;
  undefined1 local_b48 [8];
  AssertionResult gtest_ar__17;
  uint64_t parsed_5;
  AssertHelper local_b10;
  Message local_b08;
  allocator<char> local_af9;
  string local_af8;
  bool local_ad1;
  undefined1 local_ad0 [8];
  AssertionResult gtest_ar__16;
  uint64_t parsed_4;
  char hex [32];
  Message local_a90;
  undefined1 local_a88 [8];
  AssertionResult gtest_ar_9;
  AssertHelper local_a58;
  Message local_a50;
  allocator<char> local_a41;
  string local_a40;
  bool local_a19;
  undefined1 local_a18 [8];
  AssertionResult gtest_ar__15;
  uint64_t parsed_3;
  AssertHelper local_9e0;
  Message local_9d8;
  allocator<char> local_9c9;
  string local_9c8;
  bool local_9a1;
  undefined1 local_9a0 [8];
  AssertionResult gtest_ar__14;
  uint64_t parsed_2;
  char octal [32];
  Message local_960;
  undefined1 local_958 [8];
  AssertionResult gtest_ar_8;
  AssertHelper local_928;
  Message local_920;
  allocator<char> local_911;
  string local_910;
  bool local_8e9;
  undefined1 local_8e8 [8];
  AssertionResult gtest_ar__13;
  uint64_t parsed_1;
  AssertHelper local_8b0;
  Message local_8a8;
  allocator<char> local_899;
  string local_898;
  bool local_871;
  undefined1 local_870 [8];
  AssertionResult gtest_ar__12;
  uint64_t parsed;
  char decimal [32];
  unsigned_long local_830;
  uint64_t i_1;
  int64_t offset;
  AssertHelper local_800;
  Message local_7f8;
  allocator<char> local_7e9;
  string local_7e8;
  bool local_7c1;
  undefined1 local_7c0 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_790;
  Message local_788;
  allocator<char> local_779;
  string local_778;
  bool local_751;
  undefined1 local_750 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_720;
  Message local_718;
  allocator<char> local_709;
  string local_708;
  bool local_6e1;
  undefined1 local_6e0 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_6b0;
  Message local_6a8;
  allocator<char> local_699;
  string local_698;
  bool local_671;
  undefined1 local_670 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_640;
  Message local_638;
  allocator<char> local_629;
  string local_628;
  bool local_601;
  undefined1 local_600 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_5d0;
  Message local_5c8;
  allocator<char> local_5b9;
  string local_5b8;
  bool local_591;
  undefined1 local_590 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_560;
  Message local_558;
  allocator<char> local_549;
  string local_548;
  bool local_521;
  undefined1 local_520 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_4f0;
  Message local_4e8;
  allocator<char> local_4d9;
  string local_4d8;
  bool local_4b1;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_480;
  Message local_478;
  allocator<char> local_469;
  string local_468;
  bool local_441;
  undefined1 local_440 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_410;
  Message local_408;
  allocator<char> local_3f9;
  string local_3f8;
  bool local_3d1;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_3a0;
  Message local_398;
  allocator<char> local_389;
  string local_388;
  bool local_361;
  undefined1 local_360 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_330;
  Message local_328;
  allocator<char> local_319;
  string local_318;
  bool local_2f1;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_;
  uint64_t i;
  Message local_2d0;
  allocator<char> local_2c1;
  string local_2c0;
  uint64_t local_2a0;
  int local_294;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_7;
  Message local_278;
  allocator<char> local_269;
  string local_268;
  uint64_t local_248;
  int local_23c;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_6;
  Message local_220;
  allocator<char> local_211;
  string local_210;
  uint64_t local_1f0;
  int local_1e4;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_5;
  Message local_1c8;
  allocator<char> local_1b9;
  string local_1b8;
  uint64_t local_198;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_4;
  Message local_178;
  allocator<char> local_169;
  string local_168;
  uint64_t local_148;
  uint local_13c;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_3;
  Message local_120;
  allocator<char> local_111;
  string local_110;
  uint64_t local_f0;
  uint local_e4;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_2;
  Message local_c8;
  allocator<char> local_b9;
  string local_b8;
  uint64_t local_98;
  int local_8c;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_1;
  Message local_70 [3];
  allocator<char> local_51;
  string local_50;
  uint64_t local_30;
  int local_24;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  TokenizerTest_ParseInteger_Test *this_local;
  
  local_24 = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"0",&local_51);
  local_30 = TokenizerTest::ParseInteger(&this->super_TokenizerTest,&local_50);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_20,"0","ParseInteger(\"0\")",&local_24,&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x362,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_8c = 0x7b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"123",&local_b9);
  local_98 = TokenizerTest::ParseInteger(&this->super_TokenizerTest,&local_b8);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_88,"123","ParseInteger(\"123\")",&local_8c,&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x363,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  local_e4 = 0xabcdef12;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"0xabcdef12",&local_111);
  local_f0 = TokenizerTest::ParseInteger(&this->super_TokenizerTest,&local_110);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_e0,"0xabcdef12u","ParseInteger(\"0xabcdef12\")",&local_e4,&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x364,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  local_13c = 0xabcdef12;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"0xABCDEF12",&local_169);
  local_148 = TokenizerTest::ParseInteger(&this->super_TokenizerTest,&local_168);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_138,"0xabcdef12u","ParseInteger(\"0xABCDEF12\")",&local_13c,
             &local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x365,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"0xFFFFFFFFFFFFFFFF",&local_1b9);
  local_198 = TokenizerTest::ParseInteger(&this->super_TokenizerTest,&local_1b8);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_190,"kuint64max","ParseInteger(\"0xFFFFFFFFFFFFFFFF\")",&kuint64max,
             &local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x366,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  local_1e4 = 0x53977;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"01234567",&local_211);
  local_1f0 = TokenizerTest::ParseInteger(&this->super_TokenizerTest,&local_210);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_1e0,"01234567","ParseInteger(\"01234567\")",&local_1e4,&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x367,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  local_23c = 0x123;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"0X123",&local_269);
  local_248 = TokenizerTest::ParseInteger(&this->super_TokenizerTest,&local_268);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_238,"0X123","ParseInteger(\"0X123\")",&local_23c,&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_278);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x368,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  local_294 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"0x",&local_2c1);
  local_2a0 = TokenizerTest::ParseInteger(&this->super_TokenizerTest,&local_2c0);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_290,"0","ParseInteger(\"0x\")",&local_294,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar1) {
    testing::Message::Message(&local_2d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&i,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x36b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&i,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i);
    testing::Message::~Message(&local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"zxy",&local_319);
  bVar1 = Tokenizer::ParseInteger(&local_318,0xffffffffffffffff,(uint64_t *)&gtest_ar_.message_);
  local_2f1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2f0,&local_2f1,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator(&local_319);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
  if (!bVar1) {
    testing::Message::Message(&local_328);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_2f0,
               (AssertionResult *)"Tokenizer::ParseInteger(\"zxy\", kuint64max, &i)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x370,pcVar2);
    testing::internal::AssertHelper::operator=(&local_330,&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"1.2",&local_389);
  bVar1 = Tokenizer::ParseInteger(&local_388,0xffffffffffffffff,(uint64_t *)&gtest_ar_.message_);
  local_361 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_360,&local_361,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar1) {
    testing::Message::Message(&local_398);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_360,
               (AssertionResult *)"Tokenizer::ParseInteger(\"1.2\", kuint64max, &i)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x371,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3a0,&local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"08",&local_3f9);
  bVar1 = Tokenizer::ParseInteger(&local_3f8,0xffffffffffffffff,(uint64_t *)&gtest_ar_.message_);
  local_3d1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3d0,&local_3d1,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator(&local_3f9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
  if (!bVar1) {
    testing::Message::Message(&local_408);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_3d0,
               (AssertionResult *)"Tokenizer::ParseInteger(\"08\", kuint64max, &i)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x372,pcVar2);
    testing::internal::AssertHelper::operator=(&local_410,&local_408);
    testing::internal::AssertHelper::~AssertHelper(&local_410);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,"0xg",&local_469);
  bVar1 = Tokenizer::ParseInteger(&local_468,0xffffffffffffffff,(uint64_t *)&gtest_ar_.message_);
  local_441 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_440,&local_441,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator(&local_469);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar1) {
    testing::Message::Message(&local_478);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_440,
               (AssertionResult *)"Tokenizer::ParseInteger(\"0xg\", kuint64max, &i)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_480,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x373,pcVar2);
    testing::internal::AssertHelper::operator=(&local_480,&local_478);
    testing::internal::AssertHelper::~AssertHelper(&local_480);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_478);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d8,"-1",&local_4d9);
  bVar1 = Tokenizer::ParseInteger(&local_4d8,0xffffffffffffffff,(uint64_t *)&gtest_ar_.message_);
  local_4b1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4b0,&local_4b1,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::allocator<char>::~allocator(&local_4d9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
  if (!bVar1) {
    testing::Message::Message(&local_4e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_4b0,
               (AssertionResult *)"Tokenizer::ParseInteger(\"-1\", kuint64max, &i)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x374,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4f0,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper(&local_4f0);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_4e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,"0",&local_549);
  local_521 = Tokenizer::ParseInteger(&local_548,0,(uint64_t *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_520,&local_521,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_548);
  std::allocator<char>::~allocator(&local_549);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_520);
  if (!bVar1) {
    testing::Message::Message(&local_558);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_520,
               (AssertionResult *)"Tokenizer::ParseInteger(\"0\", 0, &i)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_560,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x377,pcVar2);
    testing::internal::AssertHelper::operator=(&local_560,&local_558);
    testing::internal::AssertHelper::~AssertHelper(&local_560);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_558);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_520);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b8,"1",&local_5b9);
  bVar1 = Tokenizer::ParseInteger(&local_5b8,0,(uint64_t *)&gtest_ar_.message_);
  local_591 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_590,&local_591,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_590);
  if (!bVar1) {
    testing::Message::Message(&local_5c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_590,
               (AssertionResult *)"Tokenizer::ParseInteger(\"1\", 0, &i)","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x378,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5d0,&local_5c8);
    testing::internal::AssertHelper::~AssertHelper(&local_5d0);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_5c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_590);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_628,"1",&local_629);
  local_601 = Tokenizer::ParseInteger(&local_628,1,(uint64_t *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_600,&local_601,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_628);
  std::allocator<char>::~allocator(&local_629);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_600);
  if (!bVar1) {
    testing::Message::Message(&local_638);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_600,
               (AssertionResult *)"Tokenizer::ParseInteger(\"1\", 1, &i)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_640,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x379,pcVar2);
    testing::internal::AssertHelper::operator=(&local_640,&local_638);
    testing::internal::AssertHelper::~AssertHelper(&local_640);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_638);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_600);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_698,"12345",&local_699);
  local_671 = Tokenizer::ParseInteger(&local_698,0x3039,(uint64_t *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_670,&local_671,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_698);
  std::allocator<char>::~allocator(&local_699);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_670);
  if (!bVar1) {
    testing::Message::Message(&local_6a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_670,
               (AssertionResult *)"Tokenizer::ParseInteger(\"12345\", 12345, &i)","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x37a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6b0,&local_6a8);
    testing::internal::AssertHelper::~AssertHelper(&local_6b0);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_6a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_670);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_708,"12346",&local_709);
  bVar1 = Tokenizer::ParseInteger(&local_708,0x3039,(uint64_t *)&gtest_ar_.message_);
  local_6e1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6e0,&local_6e1,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_708);
  std::allocator<char>::~allocator(&local_709);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e0);
  if (!bVar1) {
    testing::Message::Message(&local_718);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_6e0,
               (AssertionResult *)"Tokenizer::ParseInteger(\"12346\", 12345, &i)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_720,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x37b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_720,&local_718);
    testing::internal::AssertHelper::~AssertHelper(&local_720);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_718);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_778,"0xFFFFFFFFFFFFFFFF",&local_779);
  local_751 = Tokenizer::ParseInteger(&local_778,0xffffffffffffffff,(uint64_t *)&gtest_ar_.message_)
  ;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_750,&local_751,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_778);
  std::allocator<char>::~allocator(&local_779);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_750);
  if (!bVar1) {
    testing::Message::Message(&local_788);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_750,
               (AssertionResult *)"Tokenizer::ParseInteger(\"0xFFFFFFFFFFFFFFFF\", kuint64max, &i)",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_790,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x37c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_790,&local_788);
    testing::internal::AssertHelper::~AssertHelper(&local_790);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_788);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_750);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"0x10000000000000000",&local_7e9);
  bVar1 = Tokenizer::ParseInteger(&local_7e8,0xffffffffffffffff,(uint64_t *)&gtest_ar_.message_);
  local_7c1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7c0,&local_7c1,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::allocator<char>::~allocator(&local_7e9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c0);
  if (!bVar1) {
    testing::Message::Message(&local_7f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&offset,(internal *)local_7c0,
               (AssertionResult *)"Tokenizer::ParseInteger(\"0x10000000000000000\", kuint64max, &i)"
               ,"true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_800,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x37d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_800,&local_7f8);
    testing::internal::AssertHelper::~AssertHelper(&local_800);
    std::__cxx11::string::~string((string *)&offset);
    testing::Message::~Message(&local_7f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c0);
  for (i_1 = 0xfffffffffffff9c0; (long)i_1 < 0x641; i_1 = i_1 + 1) {
    local_830 = i_1 + 0x7fffffffffffffff;
    snprintf((char *)&parsed,0x20,"%llu",local_830);
    if ((long)i_1 < 1) {
      gtest_ar__13.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0xffffffffffffffff;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_910,(char *)&parsed,&local_911);
      local_8e9 = Tokenizer::ParseInteger
                            (&local_910,0x7fffffffffffffff,(uint64_t *)&gtest_ar__13.message_);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_8e8,&local_8e9,(type *)0x0);
      std::__cxx11::string::~string((string *)&local_910);
      std::allocator<char>::~allocator(&local_911);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8e8);
      if (!bVar1) {
        testing::Message::Message(&local_920);
        pMVar3 = testing::Message::operator<<(&local_920,(char (*) [32])&parsed);
        pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [3])0x212f862);
        pMVar3 = testing::Message::operator<<(pMVar3,(unsigned_long *)&gtest_ar__13.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_8.message_,(internal *)local_8e8,
                   (AssertionResult *)"Tokenizer::ParseInteger(decimal, kint64max, &parsed)","false"
                   ,"true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_928,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x38c,pcVar2);
        testing::internal::AssertHelper::operator=(&local_928,pMVar3);
        testing::internal::AssertHelper::~AssertHelper(&local_928);
        std::__cxx11::string::~string((string *)&gtest_ar_8.message_);
        testing::Message::~Message(&local_920);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_8e8);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((EqHelper *)local_958,"parsed","i",(unsigned_long *)&gtest_ar__13.message_,
                 &local_830);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_958);
      if (!bVar1) {
        testing::Message::Message(&local_960);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_958);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)(octal + 0x18),kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x38e,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)(octal + 0x18),&local_960);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(octal + 0x18));
        testing::Message::~Message(&local_960);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_958);
    }
    else {
      gtest_ar__12.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0xffffffffffffffff;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_898,(char *)&parsed,&local_899);
      bVar1 = Tokenizer::ParseInteger
                        (&local_898,0x7fffffffffffffff,(uint64_t *)&gtest_ar__12.message_);
      local_871 = (bool)(~bVar1 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_870,&local_871,(type *)0x0);
      std::__cxx11::string::~string((string *)&local_898);
      std::allocator<char>::~allocator(&local_899);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_870);
      if (!bVar1) {
        testing::Message::Message(&local_8a8);
        pMVar3 = testing::Message::operator<<(&local_8a8,(char (*) [32])&parsed);
        pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [3])0x212f862);
        pMVar3 = testing::Message::operator<<(pMVar3,(unsigned_long *)&gtest_ar__12.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&parsed_1,(internal *)local_870,
                   (AssertionResult *)"Tokenizer::ParseInteger(decimal, kint64max, &parsed)","true",
                   "false",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_8b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x388,pcVar2);
        testing::internal::AssertHelper::operator=(&local_8b0,pMVar3);
        testing::internal::AssertHelper::~AssertHelper(&local_8b0);
        std::__cxx11::string::~string((string *)&parsed_1);
        testing::Message::~Message(&local_8a8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_870);
    }
    snprintf((char *)&parsed_2,0x20,"0%llo",local_830);
    if ((long)i_1 < 1) {
      gtest_ar__15.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0xffffffffffffffff;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a40,(char *)&parsed_2,&local_a41);
      local_a19 = Tokenizer::ParseInteger
                            (&local_a40,0x7fffffffffffffff,(uint64_t *)&gtest_ar__15.message_);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_a18,&local_a19,(type *)0x0);
      std::__cxx11::string::~string((string *)&local_a40);
      std::allocator<char>::~allocator(&local_a41);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a18);
      if (!bVar1) {
        testing::Message::Message(&local_a50);
        pMVar3 = testing::Message::operator<<(&local_a50,(char (*) [32])&parsed_2);
        pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [3])0x212f862);
        pMVar3 = testing::Message::operator<<(pMVar3,(unsigned_long *)&gtest_ar__15.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_9.message_,(internal *)local_a18,
                   (AssertionResult *)"Tokenizer::ParseInteger(octal, kint64max, &parsed)","false",
                   "true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_a58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x398,pcVar2);
        testing::internal::AssertHelper::operator=(&local_a58,pMVar3);
        testing::internal::AssertHelper::~AssertHelper(&local_a58);
        std::__cxx11::string::~string((string *)&gtest_ar_9.message_);
        testing::Message::~Message(&local_a50);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_a18);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((EqHelper *)local_a88,"parsed","i",(unsigned_long *)&gtest_ar__15.message_,
                 &local_830);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a88);
      if (!bVar1) {
        testing::Message::Message(&local_a90);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a88);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)(hex + 0x18),kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x39a,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)(hex + 0x18),&local_a90);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(hex + 0x18));
        testing::Message::~Message(&local_a90);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_a88);
    }
    else {
      gtest_ar__14.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0xffffffffffffffff;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9c8,(char *)&parsed_2,&local_9c9);
      bVar1 = Tokenizer::ParseInteger
                        (&local_9c8,0x7fffffffffffffff,(uint64_t *)&gtest_ar__14.message_);
      local_9a1 = (bool)(~bVar1 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_9a0,&local_9a1,(type *)0x0);
      std::__cxx11::string::~string((string *)&local_9c8);
      std::allocator<char>::~allocator(&local_9c9);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9a0);
      if (!bVar1) {
        testing::Message::Message(&local_9d8);
        pMVar3 = testing::Message::operator<<(&local_9d8,(char (*) [32])&parsed_2);
        pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [3])0x212f862);
        pMVar3 = testing::Message::operator<<(pMVar3,(unsigned_long *)&gtest_ar__14.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&parsed_3,(internal *)local_9a0,
                   (AssertionResult *)"Tokenizer::ParseInteger(octal, kint64max, &parsed)","true",
                   "false",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_9e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x394,pcVar2);
        testing::internal::AssertHelper::operator=(&local_9e0,pMVar3);
        testing::internal::AssertHelper::~AssertHelper(&local_9e0);
        std::__cxx11::string::~string((string *)&parsed_3);
        testing::Message::~Message(&local_9d8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_9a0);
    }
    snprintf((char *)&parsed_4,0x20,"0x%llx",local_830);
    if ((long)i_1 < 1) {
      gtest_ar__17.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0xffffffffffffffff;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b70,(char *)&parsed_4,&local_b71);
      local_b49 = Tokenizer::ParseInteger
                            (&local_b70,0x7fffffffffffffff,(uint64_t *)&gtest_ar__17.message_);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_b48,&local_b49,(type *)0x0);
      std::__cxx11::string::~string((string *)&local_b70);
      std::allocator<char>::~allocator(&local_b71);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b48);
      if (!bVar1) {
        testing::Message::Message(&local_b80);
        pMVar3 = testing::Message::operator<<(&local_b80,(char (*) [32])&parsed_4);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_10.message_,(internal *)local_b48,
                   (AssertionResult *)"Tokenizer::ParseInteger(hex, kint64max, &parsed)","false",
                   "true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_b88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3a4,pcVar2);
        testing::internal::AssertHelper::operator=(&local_b88,pMVar3);
        testing::internal::AssertHelper::~AssertHelper(&local_b88);
        std::__cxx11::string::~string((string *)&gtest_ar_10.message_);
        testing::Message::~Message(&local_b80);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_b48);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((EqHelper *)local_bb8,"parsed","i",(unsigned_long *)&gtest_ar__17.message_,
                 &local_830);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bb8);
      if (!bVar1) {
        testing::Message::Message(&local_bc0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_bb8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&offset_1,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3a5,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&offset_1,&local_bc0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&offset_1);
        testing::Message::~Message(&local_bc0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_bb8);
    }
    else {
      gtest_ar__16.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0xffffffffffffffff;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_af8,(char *)&parsed_4,&local_af9);
      bVar1 = Tokenizer::ParseInteger
                        (&local_af8,0x7fffffffffffffff,(uint64_t *)&gtest_ar__16.message_);
      local_ad1 = (bool)(~bVar1 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_ad0,&local_ad1,(type *)0x0);
      std::__cxx11::string::~string((string *)&local_af8);
      std::allocator<char>::~allocator(&local_af9);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ad0);
      if (!bVar1) {
        testing::Message::Message(&local_b08);
        pMVar3 = testing::Message::operator<<(&local_b08,(char (*) [32])&parsed_4);
        pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [3])0x212f862);
        pMVar3 = testing::Message::operator<<(pMVar3,(unsigned_long *)&gtest_ar__16.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&parsed_5,(internal *)local_ad0,
                   (AssertionResult *)"Tokenizer::ParseInteger(hex, kint64max, &parsed)","true",
                   "false",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_b10,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3a0,pcVar2);
        testing::internal::AssertHelper::operator=(&local_b10,pMVar3);
        testing::internal::AssertHelper::~AssertHelper(&local_b10);
        std::__cxx11::string::~string((string *)&parsed_5);
        testing::Message::~Message(&local_b08);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_ad0);
    }
  }
  for (i_2 = 0xfffffffffffff9c0; (long)i_2 < 0x641; i_2 = i_2 + 1) {
    decimal_1._24_8_ = i_2 - 1;
    snprintf((char *)&parsed_6,0x20,"1844674407370955%04llu",i_2 + 0x64f);
    if ((long)i_2 < 1) {
      gtest_ar__19.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0xffffffffffffffff;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_cb0,(char *)&parsed_6,&local_cb1);
      local_c89 = Tokenizer::ParseInteger
                            (&local_cb0,0xffffffffffffffff,(uint64_t *)&gtest_ar__19.message_);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_c88,&local_c89,(type *)0x0);
      std::__cxx11::string::~string((string *)&local_cb0);
      std::allocator<char>::~allocator(&local_cb1);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c88);
      if (!bVar1) {
        testing::Message::Message(&local_cc0);
        pMVar3 = testing::Message::operator<<(&local_cc0,(char (*) [32])&parsed_6);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_11.message_,(internal *)local_c88,
                   (AssertionResult *)"Tokenizer::ParseInteger(decimal, kuint64max, &parsed)",
                   "false","true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_cc8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3bb,pcVar2);
        testing::internal::AssertHelper::operator=(&local_cc8,pMVar3);
        testing::internal::AssertHelper::~AssertHelper(&local_cc8);
        std::__cxx11::string::~string((string *)&gtest_ar_11.message_);
        testing::Message::~Message(&local_cc0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_c88);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((EqHelper *)local_cf8,"parsed","i",(unsigned_long *)&gtest_ar__19.message_,
                 (unsigned_long *)(decimal_1 + 0x18));
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cf8);
      if (!bVar1) {
        testing::Message::Message(&local_d00);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_cf8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&i_3,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3bd,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&i_3,&local_d00);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_3);
        testing::Message::~Message(&local_d00);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_cf8);
    }
    else {
      gtest_ar__18.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0xffffffffffffffff;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c38,(char *)&parsed_6,&local_c39);
      bVar1 = Tokenizer::ParseInteger
                        (&local_c38,0xffffffffffffffff,(uint64_t *)&gtest_ar__18.message_);
      local_c11 = (bool)(~bVar1 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_c10,&local_c11,(type *)0x0);
      std::__cxx11::string::~string((string *)&local_c38);
      std::allocator<char>::~allocator(&local_c39);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c10);
      if (!bVar1) {
        testing::Message::Message(&local_c48);
        pMVar3 = testing::Message::operator<<(&local_c48,(char (*) [32])&parsed_6);
        pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [3])0x212f862);
        pMVar3 = testing::Message::operator<<(pMVar3,(unsigned_long *)&gtest_ar__18.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&parsed_7,(internal *)local_c10,
                   (AssertionResult *)"Tokenizer::ParseInteger(decimal, kuint64max, &parsed)","true"
                   ,"false",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_c50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3b7,pcVar2);
        testing::internal::AssertHelper::operator=(&local_c50,pMVar3);
        testing::internal::AssertHelper::~AssertHelper(&local_c50);
        std::__cxx11::string::~string((string *)&parsed_7);
        testing::Message::~Message(&local_c48);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_c10);
    }
    local_d10 = i_2 - 1;
    if ((long)i_2 < 1) {
      snprintf((char *)&parsed_9,0x20,"0%llo",local_d10);
      gtest_ar__21.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0xffffffffffffffff;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e18,(char *)&parsed_9,&local_e19);
      local_df1 = Tokenizer::ParseInteger
                            (&local_e18,0xffffffffffffffff,(uint64_t *)&gtest_ar__21.message_);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_df0,&local_df1,(type *)0x0);
      std::__cxx11::string::~string((string *)&local_e18);
      std::allocator<char>::~allocator(&local_e19);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_df0);
      if (!bVar1) {
        testing::Message::Message(&local_e28);
        pMVar3 = testing::Message::operator<<(&local_e28,(char (*) [32])&parsed_9);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_12.message_,(internal *)local_df0,
                   (AssertionResult *)"Tokenizer::ParseInteger(octal, kuint64max, &parsed)","false",
                   "true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e30,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3cd,pcVar2);
        testing::internal::AssertHelper::operator=(&local_e30,pMVar3);
        testing::internal::AssertHelper::~AssertHelper(&local_e30);
        std::__cxx11::string::~string((string *)&gtest_ar_12.message_);
        testing::Message::~Message(&local_e28);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_df0);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((EqHelper *)local_e60,"parsed","i",(unsigned_long *)&gtest_ar__21.message_,
                 &local_d10);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e60);
      if (!bVar1) {
        testing::Message::Message(&local_e68);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e60);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&ui,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3cf,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&ui,&local_e68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ui);
        testing::Message::~Message(&local_e68);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_e60);
    }
    else {
      snprintf((char *)&parsed_8,0x20,"0200000000000000000%04llo",i_2 - 1);
      gtest_ar__20.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0xffffffffffffffff;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d78,(char *)&parsed_8,&local_d79);
      bVar1 = Tokenizer::ParseInteger
                        (&local_d78,0xffffffffffffffff,(uint64_t *)&gtest_ar__20.message_);
      local_d51 = (bool)(~bVar1 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_d50,&local_d51,(type *)0x0);
      std::__cxx11::string::~string((string *)&local_d78);
      std::allocator<char>::~allocator(&local_d79);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d50);
      if (!bVar1) {
        testing::Message::Message(&local_d88);
        pMVar3 = testing::Message::operator<<(&local_d88,(char (*) [32])&parsed_8);
        pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [3])0x212f862);
        pMVar3 = testing::Message::operator<<(pMVar3,(unsigned_long *)&gtest_ar__20.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_db0,(internal *)local_d50,
                   (AssertionResult *)"Tokenizer::ParseInteger(octal, kuint64max, &parsed)","true",
                   "false",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_d90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3c7,pcVar2);
        testing::internal::AssertHelper::operator=(&local_d90,pMVar3);
        testing::internal::AssertHelper::~AssertHelper(&local_d90);
        std::__cxx11::string::~string((string *)&local_db0);
        testing::Message::~Message(&local_d88);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d50);
    }
    hex_1._24_8_ = i_2 - 1;
    if ((long)i_2 < 1) {
      snprintf((char *)&parsed_10,0x20,"0x%llx",hex_1._24_8_);
      gtest_ar__23.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0xffffffffffffffff;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f50,(char *)&parsed_10,&local_f51);
      local_f29 = Tokenizer::ParseInteger
                            (&local_f50,0xffffffffffffffff,(uint64_t *)&gtest_ar__23.message_);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_f28,&local_f29,(type *)0x0);
      std::__cxx11::string::~string((string *)&local_f50);
      std::allocator<char>::~allocator(&local_f51);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f28);
      if (!bVar1) {
        testing::Message::Message(&local_f60);
        pMVar3 = testing::Message::operator<<(&local_f60,(char (*) [32])&parsed_10);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_13.message_,(internal *)local_f28,
                   (AssertionResult *)"Tokenizer::ParseInteger(hex, kuint64max, &parsed)","false",
                   "true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_f68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3de,pcVar2);
        testing::internal::AssertHelper::operator=(&local_f68,pMVar3);
        testing::internal::AssertHelper::~AssertHelper(&local_f68);
        std::__cxx11::string::~string((string *)&gtest_ar_13.message_);
        testing::Message::~Message(&local_f60);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_f28);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((EqHelper *)local_f98,"parsed","ui",(unsigned_long *)&gtest_ar__23.message_,
                 (unsigned_long *)(hex_1 + 0x18));
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f98);
      if (!bVar1) {
        testing::Message::Message(&local_fa0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f98);
        testing::internal::AssertHelper::AssertHelper
                  (&local_fa8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3df,pcVar2);
        testing::internal::AssertHelper::operator=(&local_fa8,&local_fa0);
        testing::internal::AssertHelper::~AssertHelper(&local_fa8);
        testing::Message::~Message(&local_fa0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_f98);
    }
    else {
      snprintf((char *)&parsed_10,0x20,"0x1000000000000%04llx",i_2 - 1);
      gtest_ar__22.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0xffffffffffffffff;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ed8,(char *)&parsed_10,&local_ed9);
      bVar1 = Tokenizer::ParseInteger
                        (&local_ed8,0xffffffffffffffff,(uint64_t *)&gtest_ar__22.message_);
      local_eb1 = (bool)(~bVar1 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_eb0,&local_eb1,(type *)0x0);
      std::__cxx11::string::~string((string *)&local_ed8);
      std::allocator<char>::~allocator(&local_ed9);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_eb0);
      if (!bVar1) {
        testing::Message::Message(&local_ee8);
        pMVar3 = testing::Message::operator<<(&local_ee8,(char (*) [32])&parsed_10);
        pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [3])0x212f862);
        pMVar3 = testing::Message::operator<<(pMVar3,(unsigned_long *)&gtest_ar__22.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&parsed_11,(internal *)local_eb0,
                   (AssertionResult *)"Tokenizer::ParseInteger(hex, kuint64max, &parsed)","true",
                   "false",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_ef0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3d9,pcVar2);
        testing::internal::AssertHelper::operator=(&local_ef0,pMVar3);
        testing::internal::AssertHelper::~AssertHelper(&local_ef0);
        std::__cxx11::string::~string((string *)&parsed_11);
        testing::Message::~Message(&local_ee8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_eb0);
    }
  }
  return;
}

Assistant:

TEST_F(TokenizerTest, ParseInteger) {
  EXPECT_EQ(0, ParseInteger("0"));
  EXPECT_EQ(123, ParseInteger("123"));
  EXPECT_EQ(0xabcdef12u, ParseInteger("0xabcdef12"));
  EXPECT_EQ(0xabcdef12u, ParseInteger("0xABCDEF12"));
  EXPECT_EQ(kuint64max, ParseInteger("0xFFFFFFFFFFFFFFFF"));
  EXPECT_EQ(01234567, ParseInteger("01234567"));
  EXPECT_EQ(0X123, ParseInteger("0X123"));

  // Test invalid integers that may still be tokenized as integers.
  EXPECT_EQ(0, ParseInteger("0x"));

  uint64_t i;

  // Test invalid integers that will never be tokenized as integers.
  EXPECT_FALSE(Tokenizer::ParseInteger("zxy", kuint64max, &i));
  EXPECT_FALSE(Tokenizer::ParseInteger("1.2", kuint64max, &i));
  EXPECT_FALSE(Tokenizer::ParseInteger("08", kuint64max, &i));
  EXPECT_FALSE(Tokenizer::ParseInteger("0xg", kuint64max, &i));
  EXPECT_FALSE(Tokenizer::ParseInteger("-1", kuint64max, &i));

  // Test overflows.
  EXPECT_TRUE(Tokenizer::ParseInteger("0", 0, &i));
  EXPECT_FALSE(Tokenizer::ParseInteger("1", 0, &i));
  EXPECT_TRUE(Tokenizer::ParseInteger("1", 1, &i));
  EXPECT_TRUE(Tokenizer::ParseInteger("12345", 12345, &i));
  EXPECT_FALSE(Tokenizer::ParseInteger("12346", 12345, &i));
  EXPECT_TRUE(Tokenizer::ParseInteger("0xFFFFFFFFFFFFFFFF", kuint64max, &i));
  EXPECT_FALSE(Tokenizer::ParseInteger("0x10000000000000000", kuint64max, &i));

  // Test near the limits of signed parsing (values in kint64max +/- 1600)
  for (int64_t offset = -1600; offset <= 1600; ++offset) {
    // We make sure to perform an unsigned addition so that we avoid signed
    // overflow, which would be undefined behavior.
    uint64_t i = 0x7FFFFFFFFFFFFFFFu + static_cast<uint64_t>(offset);
    char decimal[32];
    snprintf(decimal, 32, "%llu", static_cast<unsigned long long>(i));
    if (offset > 0) {
      uint64_t parsed = -1;
      EXPECT_FALSE(Tokenizer::ParseInteger(decimal, kint64max, &parsed))
          << decimal << "=>" << parsed;
    } else {
      uint64_t parsed = -1;
      EXPECT_TRUE(Tokenizer::ParseInteger(decimal, kint64max, &parsed))
          << decimal << "=>" << parsed;
      EXPECT_EQ(parsed, i);
    }
    char octal[32];
    snprintf(octal, 32, "0%llo", static_cast<unsigned long long>(i));
    if (offset > 0) {
      uint64_t parsed = -1;
      EXPECT_FALSE(Tokenizer::ParseInteger(octal, kint64max, &parsed))
          << octal << "=>" << parsed;
    } else {
      uint64_t parsed = -1;
      EXPECT_TRUE(Tokenizer::ParseInteger(octal, kint64max, &parsed))
          << octal << "=>" << parsed;
      EXPECT_EQ(parsed, i);
    }
    char hex[32];
    snprintf(hex, 32, "0x%llx", static_cast<unsigned long long>(i));
    if (offset > 0) {
      uint64_t parsed = -1;
      EXPECT_FALSE(Tokenizer::ParseInteger(hex, kint64max, &parsed))
          << hex << "=>" << parsed;
    } else {
      uint64_t parsed = -1;
      EXPECT_TRUE(Tokenizer::ParseInteger(hex, kint64max, &parsed)) << hex;
      EXPECT_EQ(parsed, i);
    }
    // EXPECT_NE(offset, -237);
  }

  // Test near the limits of unsigned parsing (values in kuint64max +/- 1600)
  // By definition, values greater than kuint64max cannot be held in a uint64_t
  // variable, so printing them is a little tricky; fortunately all but the
  // last four digits are known, so we can hard-code them in the printf string,
  // and we only need to format the last 4.
  for (int64_t offset = -1600; offset <= 1600; ++offset) {
    {
      uint64_t i = 18446744073709551615u + offset;
      char decimal[32];
      snprintf(decimal, 32, "1844674407370955%04llu",
               static_cast<unsigned long long>(1615 + offset));
      if (offset > 0) {
        uint64_t parsed = -1;
        EXPECT_FALSE(Tokenizer::ParseInteger(decimal, kuint64max, &parsed))
            << decimal << "=>" << parsed;
      } else {
        uint64_t parsed = -1;
        EXPECT_TRUE(Tokenizer::ParseInteger(decimal, kuint64max, &parsed))
            << decimal;
        EXPECT_EQ(parsed, i);
      }
    }
    {
      uint64_t i = 01777777777777777777777u + offset;
      if (offset > 0) {
        char octal[32];
        snprintf(octal, 32, "0200000000000000000%04llo",
                 static_cast<unsigned long long>(offset - 1));
        uint64_t parsed = -1;
        EXPECT_FALSE(Tokenizer::ParseInteger(octal, kuint64max, &parsed))
            << octal << "=>" << parsed;
      } else {
        char octal[32];
        snprintf(octal, 32, "0%llo", static_cast<unsigned long long>(i));
        uint64_t parsed = -1;
        EXPECT_TRUE(Tokenizer::ParseInteger(octal, kuint64max, &parsed))
            << octal;
        EXPECT_EQ(parsed, i);
      }
    }
    {
      uint64_t ui = 0xffffffffffffffffu + offset;
      char hex[32];
      if (offset > 0) {
        snprintf(hex, 32, "0x1000000000000%04llx",
                 static_cast<unsigned long long>(offset - 1));
        uint64_t parsed = -1;
        EXPECT_FALSE(Tokenizer::ParseInteger(hex, kuint64max, &parsed))
            << hex << "=>" << parsed;
      } else {
        snprintf(hex, 32, "0x%llx", static_cast<unsigned long long>(ui));
        uint64_t parsed = -1;
        EXPECT_TRUE(Tokenizer::ParseInteger(hex, kuint64max, &parsed)) << hex;
        EXPECT_EQ(parsed, ui);
      }
    }
  }
}